

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

void __thiscall fasttext::Matrix::dump(Matrix *this,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  poVar1 = std::ostream::_M_insert<long>((long)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (0 < this->m_) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      if (0 < this->n_) {
        lVar2 = 0;
        do {
          if (lVar2 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
          }
          std::ostream::_M_insert<double>
                    ((double)*(float *)((long)(this->data_).
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                       lVar2 * 4 + this->n_ * lVar3));
          lVar2 = lVar2 + 1;
        } while (lVar2 < this->n_);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
      std::ostream::put((char)out);
      std::ostream::flush();
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar4 < this->m_);
  }
  return;
}

Assistant:

void Matrix::dump(std::ostream& out) const {
  out << m_ << " " << n_ << std::endl;
  for (int64_t i = 0; i < m_; i++) {
    for (int64_t j = 0; j < n_; j++) {
      if (j > 0) {
        out << " ";
      }
      out << at(i, j);
    }
    out << std::endl;
  }
}